

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::disconnectBroker(CoreBroker *this,BasicBrokerInfo *brk)

{
  pointer pBVar1;
  BasicBrokerInfo *subbrk;
  pointer pBVar2;
  ActionMessage dis;
  ActionMessage AStack_d8;
  
  markAsDisconnected(this,(GlobalBrokerId)(brk->global_id).gid);
  checkInFlightQueries(this,(GlobalBrokerId)(brk->global_id).gid);
  if (((this->super_BrokerBase).brokerState._M_i < OPERATING) &&
     ((this->super_BrokerBase).field_0x294 == '\x01')) {
    ActionMessage::ActionMessage(&AStack_d8,cmd_broadcast_disconnect);
    AStack_d8.source_id.gid = (brk->global_id).gid;
    broadcast(this,&AStack_d8);
    UnknownHandleManager::clearFederateUnknowns
              (&this->unknownHandles,(GlobalFederateId)(brk->global_id).gid);
    if (brk->_core == false) {
      pBVar1 = (this->mBrokers).dataStorage.
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar2 = (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start; pBVar2 != pBVar1; pBVar2 = pBVar2 + 1
          ) {
        if (((pBVar2->parent).gid == (brk->global_id).gid) && (pBVar2->_core == true)) {
          UnknownHandleManager::clearFederateUnknowns
                    (&this->unknownHandles,(GlobalFederateId)(pBVar2->global_id).gid);
        }
      }
    }
    ActionMessage::~ActionMessage(&AStack_d8);
  }
  return;
}

Assistant:

void CoreBroker::disconnectBroker(BasicBrokerInfo& brk)
{
    markAsDisconnected(brk.global_id);
    checkInFlightQueries(brk.global_id);
    if (getBrokerState() < BrokerState::OPERATING) {
        if (isRootc) {
            ActionMessage dis(CMD_BROADCAST_DISCONNECT);
            dis.source_id = brk.global_id;
            broadcast(dis);
            unknownHandles.clearFederateUnknowns(brk.global_id);
            if (!brk._core) {
                for (const auto& subbrk : mBrokers) {
                    if ((subbrk.parent == brk.global_id) && (subbrk._core)) {
                        unknownHandles.clearFederateUnknowns(subbrk.global_id);
                    }
                }
            }
        }
    }
}